

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEditPrivate::interpret(QDateTimeEditPrivate *this,EmitPolicy ep)

{
  int iVar1;
  QAbstractSpinBoxPrivate *this_00;
  undefined4 in_ESI;
  QDateTimeEditPrivate *in_RDI;
  long in_FS_OFFSET;
  State state;
  QDateTimeEdit *q;
  int pos;
  QString tmp;
  FieldInfoFlag in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar2;
  uint in_stack_ffffffffffffffb0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffc0;
  QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4> local_28;
  int local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QAbstractSpinBoxPrivate *)q_func(in_RDI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&(in_RDI->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
            (&local_20);
  local_24 = QLineEdit::cursorPosition
                       ((QLineEdit *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  iVar1 = (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0x1a0))
                    (this_00,&local_20,&local_24);
  uVar3 = in_stack_ffffffffffffffb0 & 0xffffff;
  if ((iVar1 != 2) &&
     (uVar3 = in_stack_ffffffffffffffb0 & 0xffffff,
     (in_RDI->super_QAbstractSpinBoxPrivate).correctionMode == CorrectToPreviousValue)) {
    uVar2 = true;
    if ((iVar1 != 0) && (uVar2 = true, -1 < *(int *)&in_RDI->field_0x3e0)) {
      QDateTimeParser::fieldInfo((int)in_RDI + 0x3d8);
      local_28.super_QFlagsStorage<QDateTimeParser::FieldInfoFlag>.i =
           (QFlagsStorage<QDateTimeParser::FieldInfoFlag>)
           QFlags<QDateTimeParser::FieldInfoFlag>::operator&
                     ((QFlags<QDateTimeParser::FieldInfoFlag> *)
                      CONCAT17(uVar2,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c);
      uVar2 = QFlags<QDateTimeParser::FieldInfoFlag>::operator!
                        ((QFlags<QDateTimeParser::FieldInfoFlag> *)&local_28);
    }
    uVar3 = CONCAT13(uVar2,(int3)uVar3);
  }
  if ((char)(uVar3 >> 0x18) == '\0') {
    QAbstractSpinBoxPrivate::interpret
              ((QAbstractSpinBoxPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffc0),
               (EmitPolicy)((ulong)this_00 >> 0x20));
  }
  else {
    QAbstractSpinBoxPrivate::setValue
              (this_00,(QVariant *)CONCAT44(iVar1,uVar3),(EmitPolicy)((ulong)in_RDI >> 0x20),
               SUB81((ulong)in_RDI >> 0x18,0));
    updateTimeZone(in_RDI);
  }
  QString::~QString((QString *)0x561b8f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::interpret(EmitPolicy ep)
{
    Q_Q(QDateTimeEdit);
    QString tmp = displayText();
    int pos = edit->cursorPosition();
    const QValidator::State state = q->validate(tmp, pos);
    if (state != QValidator::Acceptable
        && correctionMode == QAbstractSpinBox::CorrectToPreviousValue
        && (state == QValidator::Invalid
            || currentSectionIndex < 0
            || !(fieldInfo(currentSectionIndex) & AllowPartial))) {
        setValue(value, ep);
        updateTimeZone();
    } else {
        QAbstractSpinBoxPrivate::interpret(ep);
    }
}